

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall application::handle_command(application *this)

{
  anon_class_8_1_8991fb9c_for_handler_ local_18;
  application *local_10;
  application *this_local;
  
  local_18.this = this;
  local_10 = this;
  boost::asio::
  async_read_until<boost::asio::posix::basic_stream_descriptor<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,std::allocator<char>,application::handle_command()::__0>
            (&this->_command_descriptor,&this->_command_buffer,'\n',&local_18);
  return;
}

Assistant:

void application::handle_command()
{
    boost::asio::async_read_until(_command_descriptor, _command_buffer, '\n', [this](const boost::system::error_code& error_code, std::size_t length)
    {
        std::string request{boost::asio::buffers_begin(_command_buffer.data()), 
                            boost::asio::buffers_end(_command_buffer.data())};
        _command_buffer.consume(length);

        std::vector<std::string> results;
        boost::split(results, request, [](char c){return c == ' ';});

        std::pair<bool, node_type> src = string_to_node(results[0]);
        std::pair<bool, node_type> dst = string_to_node(results[1]);
        if(src.first == false || dst.first == false)
        {
            std::cout << "Wrong input for src/dst. Only D, P0, ..., P7, I1, ..., I4 allowed.\n";
            _command_buffer.consume(length);
            return;
        } 

        std::uint32_t passengers = 0;
        try
        {
            passengers = std::stoi(results[2]);
        }
        catch(const std::invalid_argument& e)
        {
            std::cout << "Wrong input for passenger count\n"; 
            handle_command();
            return;
        }
        
        _cab_manager.add_request(src.second, dst.second, passengers);
        handle_command();
    });
}